

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# degree_histogram_converter_impl.h
# Opt level: O3

void __thiscall
degree_histogram_converter::Converter<label::StringLabel>::create_histogram
          (Converter<label::StringLabel> *this,
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
          *trees_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection)

{
  pointer pNVar1;
  pointer tree_node;
  int tree_size;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  degree_histogram;
  int local_74;
  vector<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
  *local_70;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  tree_node = (trees_collection->
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (tree_node != pNVar1) {
    local_70 = (vector<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
                *)histogram_collection;
    do {
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_74 = 0;
      local_68._M_buckets = &local_68._M_single_bucket;
      create_degree_histrogram
                (this,tree_node,
                 (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&local_68,&local_74);
      std::
      vector<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>,std::allocator<std::pair<int,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>>>>
      ::
      emplace_back<int&,std::unordered_map<int,int,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,int>>>&>
                (local_70,&local_74,
                 (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&local_68);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      tree_node = tree_node + 1;
    } while (tree_node != pNVar1);
  }
  return;
}

Assistant:

void Converter<Label>::create_histogram(
    const std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection) {

  // for each tree in the tree collection
  for (const auto& tree: trees_collection) {
    // stores the number of nodes per degree
    std::unordered_map<int, int> degree_histogram;
    // stores the number of nodes per degree
    int tree_size = 0;
    // traverse tree and store number of nodes per degree
    create_degree_histrogram(tree, degree_histogram, tree_size);
    // add degree histogram to collection
    histogram_collection.emplace_back(tree_size, degree_histogram);
  }
}